

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O2

void __thiscall
ExchCXX::detail::LibxcKernelImpl::eval_exc_vxc_
          (LibxcKernelImpl *this,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
          host_buffer_type eps,host_buffer_type vrho,host_buffer_type vsigma)

{
  int iVar1;
  exchcxx_exception *this_00;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  throw_if_uninitialized(this);
  iVar1 = (*(this->super_XCKernelImpl)._vptr_XCKernelImpl[4])(this);
  if ((char)iVar1 != '\0') {
    xc_gga_exc_vxc(&this->kernel_,(long)N,rho,sigma,eps,vrho,vsigma);
    return;
  }
  this_00 = (exchcxx_exception *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/src/libxc.cxx"
             ,&local_71);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"KERNEL IS NOT GGA",&local_72);
  exchcxx_exception::exchcxx_exception(this_00,&local_50,0x127,&local_70);
  __cxa_throw(this_00,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
}

Assistant:

GGA_EXC_VXC_GENERATOR( LibxcKernelImpl::eval_exc_vxc_ ) const {

  throw_if_uninitialized();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT GGA",  is_gga() );
  xc_gga_exc_vxc( &kernel_, N, rho, sigma, eps, vrho, vsigma );

}